

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O1

int QRfact(int n,realtype **h,realtype *q,int job)

{
  uint uVar1;
  ulong uVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  if (job == 0) {
    if (0 < n) {
      uVar8 = 0xffffffff;
      iVar7 = 0;
      uVar10 = 0;
      do {
        if (1 < uVar10) {
          lVar9 = 0;
          do {
            lVar5 = *(long *)((long)h + lVar9 + 8);
            dVar12 = *(double *)(*(long *)((long)h + lVar9) + uVar10 * 8);
            dVar3 = *(double *)(lVar5 + uVar10 * 8);
            dVar11 = *(double *)((long)q + lVar9 * 2);
            dVar13 = *(double *)((long)q + lVar9 * 2 + 8);
            *(double *)(*(long *)((long)h + lVar9) + uVar10 * 8) = dVar11 * dVar12 - dVar3 * dVar13;
            *(double *)(lVar5 + uVar10 * 8) = dVar13 * dVar12 + dVar3 * dVar11;
            lVar9 = lVar9 + 8;
          } while (uVar8 << 3 != lVar9);
        }
        dVar12 = h[uVar10][uVar10];
        dVar3 = h[uVar10 + 1][uVar10];
        dVar13 = 0.0;
        dVar11 = 1.0;
        if ((dVar3 != 0.0) || (NAN(dVar3))) {
          if (ABS(dVar12) <= ABS(dVar3)) {
            dVar11 = dVar12 / dVar3;
            dVar14 = dVar11 * dVar11 + 1.0;
            dVar13 = 0.0;
            if (0.0 < dVar14) {
              if (dVar14 < 0.0) {
                dVar13 = sqrt(dVar14);
              }
              else {
                dVar13 = SQRT(dVar14);
              }
            }
            dVar13 = -1.0 / dVar13;
            dVar11 = dVar11 * -dVar13;
          }
          else {
            dVar13 = dVar3 / dVar12;
            dVar14 = dVar13 * dVar13 + 1.0;
            dVar11 = 0.0;
            if (0.0 < dVar14) {
              if (dVar14 < 0.0) {
                dVar11 = sqrt(dVar14);
              }
              else {
                dVar11 = SQRT(dVar14);
              }
            }
            dVar11 = 1.0 / dVar11;
            dVar13 = dVar13 * -dVar11;
          }
        }
        q[uVar10 * 2] = dVar11;
        q[uVar10 * 2 + 1] = dVar13;
        uVar2 = uVar10 + 1;
        dVar12 = dVar12 * dVar11 - dVar3 * dVar13;
        iVar6 = (int)uVar2;
        if (dVar12 != 0.0) {
          iVar6 = iVar7;
        }
        if (!NAN(dVar12)) {
          iVar7 = iVar6;
        }
        h[uVar10][uVar10] = dVar12;
        uVar8 = (ulong)((int)uVar8 + 1);
        uVar10 = uVar2;
      } while (uVar2 != (uint)n);
      return iVar7;
    }
  }
  else {
    uVar1 = n - 1;
    lVar9 = (long)(int)uVar1;
    if (1 < n) {
      lVar5 = 0;
      do {
        lVar4 = *(long *)((long)h + lVar5 + 8);
        dVar12 = *(double *)(*(long *)((long)h + lVar5) + lVar9 * 8);
        dVar3 = *(double *)(lVar4 + lVar9 * 8);
        dVar11 = *(double *)((long)q + lVar5 * 2);
        dVar13 = *(double *)((long)q + lVar5 * 2 + 8);
        *(double *)(*(long *)((long)h + lVar5) + lVar9 * 8) = dVar11 * dVar12 - dVar3 * dVar13;
        *(double *)(lVar4 + lVar9 * 8) = dVar13 * dVar12 + dVar3 * dVar11;
        lVar5 = lVar5 + 8;
      } while ((ulong)uVar1 << 3 != lVar5);
    }
    dVar12 = h[lVar9][lVar9];
    dVar3 = h[n][lVar9];
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      if (ABS(dVar12) <= ABS(dVar3)) {
        dVar13 = dVar12 / dVar3;
        dVar11 = dVar13 * dVar13 + 1.0;
        dVar14 = 0.0;
        if (0.0 < dVar11) {
          if (dVar11 < 0.0) {
            dVar14 = sqrt(dVar11);
          }
          else {
            dVar14 = SQRT(dVar11);
          }
        }
        dVar14 = -1.0 / dVar14;
        dVar13 = dVar13 * -dVar14;
      }
      else {
        dVar14 = dVar3 / dVar12;
        dVar11 = dVar14 * dVar14 + 1.0;
        dVar13 = 0.0;
        if (0.0 < dVar11) {
          if (dVar11 < 0.0) {
            dVar13 = sqrt(dVar11);
          }
          else {
            dVar13 = SQRT(dVar11);
          }
        }
        dVar13 = 1.0 / dVar13;
        dVar14 = dVar14 * -dVar13;
      }
    }
    else {
      dVar13 = 1.0;
      dVar14 = 0.0;
    }
    q[(int)(uVar1 * 2)] = dVar13;
    q[(int)(uVar1 * 2 + 1)] = dVar14;
    dVar12 = dVar12 * dVar13 - dVar3 * dVar14;
    h[lVar9][lVar9] = dVar12;
    if ((dVar12 == 0.0) && (!NAN(dVar12))) {
      return n;
    }
  }
  return 0;
}

Assistant:

int QRfact(int n, realtype **h, realtype *q, int job)
{
  realtype c, s, temp1, temp2, temp3;
  int i, j, k, q_ptr, n_minus_1, code=0;

  switch (job) {
  case 0:

    /* Compute a new factorization of H */

    code = 0;
    for (k=0; k < n; k++) {
      
      /* Multiply column k by the previous k-1 Givens rotations */

      for (j=0; j < k-1; j++) {
	i = 2*j;
	temp1 = h[j][k];
	temp2 = h[j+1][k];
	c = q[i];
	s = q[i+1];
	h[j][k] = c*temp1 - s*temp2;
	h[j+1][k] = s*temp1 + c*temp2;
      }
      
      /* Compute the Givens rotation components c and s */

      q_ptr = 2*k;
      temp1 = h[k][k];
      temp2 = h[k+1][k];
      if( temp2 == ZERO) {
	c = ONE;
	s = ZERO;
      } else if (SUNRabs(temp2) >= SUNRabs(temp1)) {
	temp3 = temp1/temp2;
	s = -ONE/SUNRsqrt(ONE+SUNSQR(temp3));
	c = -s*temp3;
      } else {
	temp3 = temp2/temp1;
	c = ONE/SUNRsqrt(ONE+SUNSQR(temp3));
	s = -c*temp3;
      }
      q[q_ptr] = c;
      q[q_ptr+1] = s;
      if( (h[k][k] = c*temp1 - s*temp2) == ZERO) code = k+1;
    }
    break;

  default:

    /* Update the factored H to which a new column has been added */

    n_minus_1 = n - 1;
    code = 0;
    
    /* Multiply the new column by the previous n-1 Givens rotations */

    for (k=0; k < n_minus_1; k++) {
      i = 2*k;
      temp1 = h[k][n_minus_1];
      temp2 = h[k+1][n_minus_1];
      c = q[i];
      s = q[i+1];
      h[k][n_minus_1] = c*temp1 - s*temp2;
      h[k+1][n_minus_1] = s*temp1 + c*temp2;
    }
    
    /* Compute new Givens rotation and multiply it times the last two
       entries in the new column of H.  Note that the second entry of 
       this product will be 0, so it is not necessary to compute it. */

    temp1 = h[n_minus_1][n_minus_1];
    temp2 = h[n][n_minus_1];
    if (temp2 == ZERO) {
      c = ONE;
      s = ZERO;
    } else if (SUNRabs(temp2) >= SUNRabs(temp1)) {
      temp3 = temp1/temp2;
      s = -ONE/SUNRsqrt(ONE+SUNSQR(temp3));
      c = -s*temp3;
    } else {
      temp3 = temp2/temp1;
      c = ONE/SUNRsqrt(ONE+SUNSQR(temp3));
      s = -c*temp3;
    }
    q_ptr = 2*n_minus_1;
    q[q_ptr] = c;
    q[q_ptr+1] = s;
    if ((h[n_minus_1][n_minus_1] = c*temp1 - s*temp2) == ZERO)
      code = n;
  }
  
  return (code);
}